

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall duckdb::Appender::~Appender(Appender *this)

{
  ~Appender(this);
  operator_delete(this);
  return;
}

Assistant:

Appender::~Appender() {
	Destructor();
}